

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O3

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CIfStm *stm)

{
  char *pcVar1;
  IExpression *pIVar2;
  IStatement *pIVar3;
  bool bVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  TypeInfo *in_RCX;
  string errorMessage;
  undefined1 local_80 [8];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  string local_50;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: CIfStm\n",0x14);
  pIVar2 = (stm->conditionExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (((pIVar2 == (IExpression *)0x0) ||
      ((stm->positiveStatement)._M_t.
       super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
       super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
       super__Head_base<0UL,_IStatement_*,_false>._M_head_impl == (IStatement *)0x0)) ||
     ((stm->negativeStatement)._M_t.
      super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
      super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
      super__Head_base<0UL,_IStatement_*,_false>._M_head_impl == (IStatement *)0x0)) {
    CError::CError((CError *)local_80,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_80);
    paVar5 = local_70;
  }
  else {
    (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    TypeInfo::TypeInfo((TypeInfo *)local_80,ERROR_TYPE);
    bVar4 = operator==(&this->lastCalculatedType,(TypeInfo *)local_80);
    pcVar1 = local_70[0]._M_local_buf + 8;
    if (local_78._M_p != pcVar1) {
      operator_delete(local_78._M_p);
    }
    if (bVar4) {
      return;
    }
    if ((this->lastCalculatedType).type == BOOLEAN) {
      pIVar3 = (stm->positiveStatement)._M_t.
               super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
               super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
               super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
      (*(code *)*(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
      pIVar3 = (stm->negativeStatement)._M_t.
               super___uniq_ptr_impl<IStatement,_std::default_delete<IStatement>_>._M_t.
               super__Tuple_impl<0UL,_IStatement_*,_std::default_delete<IStatement>_>.
               super__Head_base<0UL,_IStatement_*,_false>._M_head_impl;
      (*(code *)*(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
      TypeInfo::TypeInfo((TypeInfo *)local_80,VOID);
      (this->lastCalculatedType).isPrimitive = (bool)local_80[0];
      *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_80._1_3_;
      (this->lastCalculatedType).type = local_80._4_4_;
      std::__cxx11::string::operator=
                ((string *)&(this->lastCalculatedType).className,(string *)&local_78);
      if (local_78._M_p == pcVar1) {
        return;
      }
      goto LAB_001211af;
    }
    TypeInfo::TypeInfo((TypeInfo *)local_80,BOOLEAN);
    CError::GetTypeErrorMessage_abi_cxx11_
              (&local_50,(CError *)local_80,&this->lastCalculatedType,in_RCX);
    if (local_78._M_p != pcVar1) {
      operator_delete(local_78._M_p);
    }
    CError::CError((CError *)local_80,&local_50,
                   &(((stm->conditionExpression)._M_t.
                      super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
                      super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
                      super__Head_base<0UL,_IExpression_*,_false>._M_head_impl)->
                    super_PositionedNode).position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_80);
    if (local_80 != (undefined1  [8])local_70) {
      operator_delete((void *)local_80);
    }
    paVar5 = &local_50.field_2;
  }
  local_78._M_p = *(pointer *)(paVar5->_M_local_buf + -0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p == paVar5) {
    return;
  }
LAB_001211af:
  operator_delete(local_78._M_p);
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CIfStm &stm )
{
    std::cout << "typechecker: CIfStm\n";

    if( stm.conditionExpression && stm.positiveStatement && stm.negativeStatement ) {
		stm.conditionExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
		if( lastCalculatedType.type != enums::TPrimitiveType::BOOLEAN ) {
			auto errorMessage = CError::GetTypeErrorMessage( enums::TPrimitiveType::BOOLEAN, lastCalculatedType );
			errors.push_back( CError( errorMessage, stm.conditionExpression->position ) );
            return;
		}
        stm.positiveStatement->Accept( *this );
        stm.negativeStatement->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
}